

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSet::spanBackUTF8
          (UnicodeSet *this,char *s,int32_t length,USetSpanCondition spanCondition)

{
  USetSpanCondition UVar1;
  UBool UVar2;
  size_t sVar3;
  int32_t local_168;
  uint local_164;
  int32_t prev;
  UChar32 c;
  undefined1 local_150 [8];
  UnicodeSetStringSpan strSpan;
  uint32_t which;
  uint8_t *s0;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  char *s_local;
  UnicodeSet *this_local;
  
  s0._0_4_ = spanCondition;
  s0._4_4_ = length;
  _spanCondition_local = (uint8_t *)s;
  s_local = (char *)this;
  if ((length < 1) || (this->bmpSet == (BMPSet *)0x0)) {
    if (length < 0) {
      sVar3 = strlen(s);
      s0._4_4_ = (int32_t)sVar3;
    }
    if (s0._4_4_ == 0) {
      this_local._4_4_ = 0;
    }
    else if (this->stringSpan == (UnicodeSetStringSpan *)0x0) {
      UVar2 = UVector::isEmpty(this->strings);
      if (UVar2 == '\0') {
        strSpan.staticLengths[0x1f] = 0x16 - ((USetSpanCondition)s0 == USET_SPAN_NOT_CONTAINED);
        UnicodeSetStringSpan::UnicodeSetStringSpan
                  ((UnicodeSetStringSpan *)local_150,this,this->strings,strSpan.staticLengths[0x1f])
        ;
        UVar2 = UnicodeSetStringSpan::needsStringSpanUTF8((UnicodeSetStringSpan *)local_150);
        if (UVar2 != '\0') {
          this_local._4_4_ =
               UnicodeSetStringSpan::spanBackUTF8
                         ((UnicodeSetStringSpan *)local_150,_spanCondition_local,s0._4_4_,
                          (USetSpanCondition)s0);
        }
        UnicodeSetStringSpan::~UnicodeSetStringSpan((UnicodeSetStringSpan *)local_150);
        if (UVar2 != '\0') {
          return this_local._4_4_;
        }
      }
      if ((USetSpanCondition)s0 != USET_SPAN_NOT_CONTAINED) {
        s0._0_4_ = USET_SPAN_CONTAINED;
      }
      do {
        local_168 = s0._4_4_;
        s0._4_4_ = s0._4_4_ + -1;
        local_164 = (uint)_spanCondition_local[s0._4_4_];
        if ((_spanCondition_local[s0._4_4_] & 0x80) != 0) {
          local_164 = utf8_prevCharSafeBody_63
                                (_spanCondition_local,0,(int32_t *)((long)&s0 + 4),local_164,-3);
        }
        UVar1 = (USetSpanCondition)s0;
        UVar2 = contains(this,local_164);
      } while ((UVar1 == (int)UVar2) && (local_168 = s0._4_4_, 0 < s0._4_4_));
      this_local._4_4_ = local_168;
    }
    else {
      this_local._4_4_ =
           UnicodeSetStringSpan::spanBackUTF8
                     (this->stringSpan,_spanCondition_local,s0._4_4_,(USetSpanCondition)s0);
    }
  }
  else {
    this_local._4_4_ = BMPSet::spanBackUTF8(this->bmpSet,(uint8_t *)s,length,spanCondition);
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSet::spanBackUTF8(const char *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        const uint8_t *s0=(const uint8_t *)s;
        return bmpSet->spanBackUTF8(s0, length, spanCondition);
    }
    if(length<0) {
        length=(int32_t)uprv_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanBackUTF8((const uint8_t *)s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::BACK_UTF8_NOT_CONTAINED :
                            UnicodeSetStringSpan::BACK_UTF8_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF8()) {
            return strSpan.spanBackUTF8((const uint8_t *)s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t prev=length;
    do {
        U8_PREV_OR_FFFD(s, 0, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=length)>0);
    return prev;
}